

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
::
find_or_prepare_insert_non_soo<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
          *this,pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                *key)

{
  ulong uVar1;
  slot_type *psVar2;
  ctrl_t *pcVar3;
  ushort uVar4;
  bool bVar5;
  uint32_t uVar6;
  int iVar7;
  uint uVar8;
  CommonFields *pCVar9;
  ctrl_t *pcVar10;
  slot_type *psVar11;
  size_t sVar12;
  PolicyFunctions *in_R9;
  ushort uVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  __m128i match;
  undefined1 auVar17 [16];
  ctrl_t cVar18;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  ctrl_t cVar33;
  ctrl_t cVar34;
  undefined1 auVar19 [16];
  iterator iVar35;
  FindInfo target;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_78;
  CommonFields *local_60;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  ctrl_t cStack_54;
  ctrl_t cStack_53;
  ctrl_t cStack_52;
  ctrl_t cStack_51;
  ctrl_t cStack_50;
  ctrl_t cStack_4f;
  ctrl_t cStack_4e;
  ctrl_t cStack_4d;
  ctrl_t cStack_4c;
  ctrl_t cStack_4b;
  ctrl_t cStack_4a;
  ctrl_t cStack_49;
  undefined1 local_48 [16];
  
  bVar5 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
          ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                    *)this);
  if (bVar5) {
    __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xf66,
                  "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, K = std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>]"
                 );
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::prefetch_heap_block
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
              *)this);
  pCVar9 = (CommonFields *)
           hash_internal::MixingHashState::
           hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_0>
                     (key);
  probe(&local_78,(CommonFields *)this,(size_t)pCVar9);
  pcVar10 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
            ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                       *)this);
  auVar15 = ZEXT216(CONCAT11((char)pCVar9,(char)pCVar9) & 0x7f7f);
  auVar15 = pshuflw(auVar15,auVar15,0);
  uVar14 = auVar15._0_4_;
  local_48._4_4_ = uVar14;
  local_48._0_4_ = uVar14;
  local_48._8_4_ = uVar14;
  local_48._12_4_ = uVar14;
  local_60 = pCVar9;
  do {
    pcVar3 = pcVar10 + local_78.offset_;
    auVar15[0] = -(local_48[0] == *pcVar3);
    auVar15[1] = -(local_48[1] == pcVar3[1]);
    auVar15[2] = -(local_48[2] == pcVar3[2]);
    auVar15[3] = -(local_48[3] == pcVar3[3]);
    auVar15[4] = -(local_48[4] == pcVar3[4]);
    auVar15[5] = -(local_48[5] == pcVar3[5]);
    auVar15[6] = -(local_48[6] == pcVar3[6]);
    auVar15[7] = -(local_48[7] == pcVar3[7]);
    auVar15[8] = -(local_48[8] == pcVar3[8]);
    auVar15[9] = -(local_48[9] == pcVar3[9]);
    auVar15[10] = -(local_48[10] == pcVar3[10]);
    auVar15[0xb] = -(local_48[0xb] == pcVar3[0xb]);
    auVar15[0xc] = -(local_48[0xc] == pcVar3[0xc]);
    auVar15[0xd] = -(local_48[0xd] == pcVar3[0xd]);
    auVar15[0xe] = -(local_48[0xe] == pcVar3[0xe]);
    auVar15[0xf] = -(local_48[0xf] == pcVar3[0xf]);
    cVar18 = *pcVar3;
    cVar20 = pcVar3[1];
    cVar21 = pcVar3[2];
    cVar22 = pcVar3[3];
    cVar23 = pcVar3[4];
    cVar24 = pcVar3[5];
    cVar25 = pcVar3[6];
    cVar26 = pcVar3[7];
    cVar27 = pcVar3[8];
    cVar28 = pcVar3[9];
    cVar29 = pcVar3[10];
    cVar30 = pcVar3[0xb];
    cVar31 = pcVar3[0xc];
    cVar32 = pcVar3[0xd];
    cVar33 = pcVar3[0xe];
    cVar34 = pcVar3[0xf];
    for (uVar13 = (ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar15[0xf] >> 7) << 0xf; uVar13 != 0; uVar13 = uVar13 - 1 & uVar13) {
      local_58 = cVar18;
      cStack_57 = cVar20;
      cStack_56 = cVar21;
      cStack_55 = cVar22;
      cStack_54 = cVar23;
      cStack_53 = cVar24;
      cStack_52 = cVar25;
      cStack_51 = cVar26;
      cStack_50 = cVar27;
      cStack_4f = cVar28;
      cStack_4e = cVar29;
      cStack_4d = cVar30;
      cStack_4c = cVar31;
      cStack_4b = cVar32;
      cStack_4a = cVar33;
      cStack_49 = cVar34;
      uVar6 = TrailingZeros<unsigned_short>(uVar13);
      psVar11 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                              *)this);
      sVar12 = uVar6 + local_78.offset_ & local_78.mask_;
      psVar2 = psVar11 + sVar12;
      auVar17._0_4_ = -(uint)(*(int *)&key->first == *(int *)&psVar2->first);
      auVar17._4_4_ = -(uint)(*(int *)((long)&key->first + 4) == *(int *)((long)&psVar2->first + 4))
      ;
      auVar17._8_4_ = -(uint)(*(int *)&key->second == *(int *)&psVar2->second);
      auVar17._12_4_ =
           -(uint)(*(int *)((long)&key->second + 4) == *(int *)((long)&psVar2->second + 4));
      auVar16._4_4_ = auVar17._0_4_;
      auVar16._0_4_ = auVar17._4_4_;
      auVar16._8_4_ = auVar17._12_4_;
      auVar16._12_4_ = auVar17._8_4_;
      iVar7 = movmskpd((int)psVar11,auVar16 & auVar17);
      if (iVar7 == 3) {
        bVar5 = false;
        goto LAB_002b1826;
      }
      cVar18 = local_58;
      cVar20 = cStack_57;
      cVar21 = cStack_56;
      cVar22 = cStack_55;
      cVar23 = cStack_54;
      cVar24 = cStack_53;
      cVar25 = cStack_52;
      cVar26 = cStack_51;
      cVar27 = cStack_50;
      cVar28 = cStack_4f;
      cVar29 = cStack_4e;
      cVar30 = cStack_4d;
      cVar31 = cStack_4c;
      cVar32 = cStack_4b;
      cVar33 = cStack_4a;
      cVar34 = cStack_49;
    }
    auVar19[0] = -(cVar18 == kEmpty);
    auVar19[1] = -(cVar20 == kEmpty);
    auVar19[2] = -(cVar21 == kEmpty);
    auVar19[3] = -(cVar22 == kEmpty);
    auVar19[4] = -(cVar23 == kEmpty);
    auVar19[5] = -(cVar24 == kEmpty);
    auVar19[6] = -(cVar25 == kEmpty);
    auVar19[7] = -(cVar26 == kEmpty);
    auVar19[8] = -(cVar27 == kEmpty);
    auVar19[9] = -(cVar28 == kEmpty);
    auVar19[10] = -(cVar29 == kEmpty);
    auVar19[0xb] = -(cVar30 == kEmpty);
    auVar19[0xc] = -(cVar31 == kEmpty);
    auVar19[0xd] = -(cVar32 == kEmpty);
    auVar19[0xe] = -(cVar33 == kEmpty);
    auVar19[0xf] = -(cVar34 == kEmpty);
    uVar13 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf;
    if (uVar13 != 0) {
      sVar12 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
               ::capacity((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                           *)this);
      pcVar10 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                           *)this);
      pCVar9 = local_60;
      bVar5 = ShouldInsertBackwardsForDebug(sVar12,(size_t)local_60,pcVar10);
      if (bVar5) {
        uVar4 = 0xf;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar8 = (ushort)((uVar4 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar8 = TrailingZeros<unsigned_short>(uVar13);
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = local_78.index_;
      sVar12 = PrepareInsertNonSoo((container_internal *)this,pCVar9,
                                   uVar8 + local_78.offset_ & local_78.mask_,target,in_R9);
      bVar5 = true;
LAB_002b1826:
      iVar35 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
               ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                              *)this,sVar12);
      __return_storage_ptr__->first = iVar35;
      __return_storage_ptr__->second = bVar5;
      return __return_storage_ptr__;
    }
    uVar1 = local_78.index_ + 0x10;
    local_78.offset_ = local_78.index_ + local_78.offset_ + 0x10 & local_78.mask_;
    local_78.index_ = uVar1;
    sVar12 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
             ::capacity((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                         *)this);
    if (sVar12 < uVar1) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf7d,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, K = std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }